

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

void lj_lex_error(LexState *ls,LexToken tok,ErrMsg em,...)

{
  char in_AL;
  undefined8 in_RCX;
  SBuf *sb;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_128 [24];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined1 local_78 [8];
  va_list argp;
  char *tokstr;
  ErrMsg em_local;
  LexToken tok_local;
  LexState *ls_local;
  char *w;
  char *local_10;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  if (tok == 0) {
    argp[0].reg_save_area = (void *)0x0;
  }
  else if (((tok == 0x11f) || (tok == 0x120)) || (tok == 0x11e)) {
    sb = &ls->sb;
    if ((int)(ls->sb).e == (int)sb->w) {
      local_10 = lj_buf_more2(sb,1);
    }
    else {
      local_10 = sb->w;
    }
    *local_10 = '\0';
    sb->w = local_10 + 1;
    argp[0].reg_save_area = (ls->sb).b;
  }
  else {
    argp[0].reg_save_area = lj_lex_token2str(ls,tok);
  }
  argp[0].overflow_arg_area = local_128;
  argp[0]._0_8_ = &stack0x00000008;
  local_78._4_4_ = 0x30;
  local_78._0_4_ = 0x18;
  lj_err_lex(ls->L,ls->chunkname,(char *)argp[0].reg_save_area,ls->linenumber,em,
             (__va_list_tag *)local_78);
}

Assistant:

void lj_lex_error(LexState *ls, LexToken tok, ErrMsg em, ...)
{
  const char *tokstr;
  va_list argp;
  if (tok == 0) {
    tokstr = NULL;
  } else if (tok == TK_name || tok == TK_string || tok == TK_number) {
    lex_save(ls, '\0');
    tokstr = ls->sb.b;
  } else {
    tokstr = lj_lex_token2str(ls, tok);
  }
  va_start(argp, em);
  lj_err_lex(ls->L, ls->chunkname, tokstr, ls->linenumber, em, argp);
  va_end(argp);
}